

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decFactor.c
# Opt level: O2

Dec_Edge_t Dec_Factor_rec(Dec_Graph_t *pFForm,Mvc_Cover_t *pCover)

{
  Vec_Int_t *p;
  Vec_Int_t *vEdgeLits;
  uint __line;
  int iVar1;
  Dec_Edge_t DVar2;
  Dec_Edge_t DVar3;
  Mvc_Cover_t *pMVar4;
  void *pvVar5;
  char *__assertion;
  Mvc_Cube_t *pCube;
  Mvc_Cover_t *pQuo;
  Mvc_Cover_t *pRem;
  Mvc_Cover_t *pDiv;
  
  iVar1 = Mvc_CoverReadCubeNum(pCover);
  if (iVar1 == 0) {
    __assertion = "Mvc_CoverReadCubeNum(pCover)";
    __line = 0x73;
  }
  else {
    pMVar4 = Mvc_CoverDivisor(pCover);
    pDiv = pMVar4;
    if (pMVar4 == (Mvc_Cover_t *)0x0) {
      pvVar5 = Abc_FrameReadManDec();
      p = *(Vec_Int_t **)((long)pvVar5 + 8);
      vEdgeLits = *(Vec_Int_t **)((long)pvVar5 + 0x10);
      p->nSize = 0;
      pCube = (Mvc_Cube_t *)&pCover->lCubes;
      while (pCube = pCube->pNext, pCube != (Mvc_Cube_t *)0x0) {
        DVar2 = Dec_FactorTrivialCube(pFForm,pCover,pCube,vEdgeLits);
        Vec_IntPush(p,(int)DVar2);
      }
      DVar2 = Dec_FactorTrivialTree_rec(pFForm,(Dec_Edge_t *)p->pArray,p->nSize,1);
      return DVar2;
    }
    Mvc_CoverDivideInternal(pCover,pMVar4,&pQuo,&pRem);
    iVar1 = Mvc_CoverReadCubeNum(pQuo);
    if (iVar1 != 0) {
      Mvc_CoverFree(pMVar4);
      Mvc_CoverFree(pRem);
      iVar1 = Mvc_CoverReadCubeNum(pQuo);
      if (iVar1 == 1) {
        DVar2 = Dec_FactorLF_rec(pFForm,pCover,pQuo);
        pMVar4 = pQuo;
      }
      else {
        Mvc_CoverMakeCubeFree(pQuo);
        Mvc_CoverDivideInternal(pCover,pQuo,&pDiv,&pRem);
        iVar1 = Mvc_CoverIsCubeFree(pDiv);
        if (iVar1 == 0) {
          pMVar4 = Mvc_CoverCommonCubeCover(pDiv);
          Mvc_CoverFree(pDiv);
          Mvc_CoverFree(pQuo);
          Mvc_CoverFree(pRem);
          DVar2 = Dec_FactorLF_rec(pFForm,pCover,pMVar4);
        }
        else {
          DVar2 = Dec_Factor_rec(pFForm,pDiv);
          DVar3 = Dec_Factor_rec(pFForm,pQuo);
          Mvc_CoverFree(pDiv);
          Mvc_CoverFree(pQuo);
          DVar2 = Dec_GraphAddNodeAnd(pFForm,DVar2,DVar3);
          iVar1 = Mvc_CoverReadCubeNum(pRem);
          pMVar4 = pRem;
          if (iVar1 != 0) {
            DVar3 = Dec_Factor_rec(pFForm,pRem);
            Mvc_CoverFree(pRem);
            DVar2 = Dec_GraphAddNodeOr(pFForm,DVar2,DVar3);
            return DVar2;
          }
        }
      }
      Mvc_CoverFree(pMVar4);
      return DVar2;
    }
    __assertion = "Mvc_CoverReadCubeNum(pQuo)";
    __line = 0x7c;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bool/dec/decFactor.c"
                ,__line,"Dec_Edge_t Dec_Factor_rec(Dec_Graph_t *, Mvc_Cover_t *)");
}

Assistant:

Dec_Edge_t Dec_Factor_rec( Dec_Graph_t * pFForm, Mvc_Cover_t * pCover )
{
    Mvc_Cover_t * pDiv, * pQuo, * pRem, * pCom;
    Dec_Edge_t eNodeDiv, eNodeQuo, eNodeRem;
    Dec_Edge_t eNodeAnd, eNode;

    // make sure the cover contains some cubes
    assert( Mvc_CoverReadCubeNum(pCover) );

    // get the divisor
    pDiv = Mvc_CoverDivisor( pCover );
    if ( pDiv == NULL )
        return Dec_FactorTrivial( pFForm, pCover );

    // divide the cover by the divisor
    Mvc_CoverDivideInternal( pCover, pDiv, &pQuo, &pRem );
    assert( Mvc_CoverReadCubeNum(pQuo) );

    Mvc_CoverFree( pDiv );
    Mvc_CoverFree( pRem );

    // check the trivial case
    if ( Mvc_CoverReadCubeNum(pQuo) == 1 )
    {
        eNode = Dec_FactorLF_rec( pFForm, pCover, pQuo );
        Mvc_CoverFree( pQuo );
        return eNode;
    }

    // make the quotient cube ABC_FREE
    Mvc_CoverMakeCubeFree( pQuo );

    // divide the cover by the quotient
    Mvc_CoverDivideInternal( pCover, pQuo, &pDiv, &pRem );

    // check the trivial case
    if ( Mvc_CoverIsCubeFree( pDiv ) )
    {
        eNodeDiv = Dec_Factor_rec( pFForm, pDiv );
        eNodeQuo = Dec_Factor_rec( pFForm, pQuo );
        Mvc_CoverFree( pDiv );
        Mvc_CoverFree( pQuo );
        eNodeAnd = Dec_GraphAddNodeAnd( pFForm, eNodeDiv, eNodeQuo );
        if ( Mvc_CoverReadCubeNum(pRem) == 0 )
        {
            Mvc_CoverFree( pRem );
            return eNodeAnd;
        }
        else
        {
            eNodeRem = Dec_Factor_rec( pFForm, pRem );
            Mvc_CoverFree( pRem );
            return Dec_GraphAddNodeOr( pFForm, eNodeAnd, eNodeRem );
        }
    }

    // get the common cube
    pCom = Mvc_CoverCommonCubeCover( pDiv );
    Mvc_CoverFree( pDiv );
    Mvc_CoverFree( pQuo );
    Mvc_CoverFree( pRem );

    // solve the simple problem
    eNode = Dec_FactorLF_rec( pFForm, pCover, pCom );
    Mvc_CoverFree( pCom );
    return eNode;
}